

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_type_lookupSelectorRecursively
          (sysbvm_context_t *context,sysbvm_tuple_t type,sysbvm_tuple_t selector)

{
  sysbvm_chunkedAllocatorChunk_t *dictionary;
  _Bool _Var1;
  sysbvm_tuple_t in_RAX;
  sysbvm_context_t *context_00;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t selector_00;
  sysbvm_tuple_t found;
  sysbvm_tuple_t local_18;
  
  if ((((ulong)context & 0xf) != 0 || context == (sysbvm_context_t *)0x0) ||
     (local_18 = in_RAX, _Var1 = sysbvm_tuple_isDummyValue((sysbvm_tuple_t)context), _Var1)) {
    sVar2 = 0;
  }
  else {
    dictionary = (context->heap).codeAllocator.firstChunk;
    if (dictionary != (sysbvm_chunkedAllocatorChunk_t *)0x0) {
      local_18 = 0;
      _Var1 = sysbvm_methodDictionary_find((sysbvm_tuple_t)dictionary,type,&local_18);
      if (_Var1) {
        return local_18;
      }
    }
    context_00 = (sysbvm_context_t *)sysbvm_type_getSupertype((sysbvm_tuple_t)context);
    sVar2 = sysbvm_type_lookupSelectorRecursively(context_00,type,selector_00);
  }
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_type_lookupSelectorRecursively(sysbvm_context_t *context, sysbvm_tuple_t type, sysbvm_tuple_t selector)
{
    if(!sysbvm_tuple_isNonNullPointer(type)) return SYSBVM_NULL_TUPLE;
    if(sysbvm_tuple_isDummyValue(type)) return SYSBVM_NULL_TUPLE;
    sysbvm_tuple_t methodDictionary = sysbvm_type_getMethodDictionary(type);
    if(methodDictionary)
    {
        sysbvm_tuple_t found = SYSBVM_NULL_TUPLE;
        if(sysbvm_methodDictionary_find(methodDictionary, selector, &found))
            return found;
    }

    return sysbvm_type_lookupSelectorRecursively(context, sysbvm_type_getSupertype(type), selector);
}